

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-literal.cc
# Opt level: O3

void __thiscall ParseInt8_Underscores_Test::TestBody(ParseInt8_Underscores_Test *this)

{
  anon_unknown.dwarf_b35c3::AssertInt8Equals('{',"12_3",Both);
  anon_unknown.dwarf_b35c3::AssertInt8Equals('{',"+12_3",SignedAndUnsigned);
  anon_unknown.dwarf_b35c3::AssertInt8Equals(0x85,"-1_23",SignedAndUnsigned);
  anon_unknown.dwarf_b35c3::AssertInt8Equals('\x13',"1______9",Both);
  anon_unknown.dwarf_b35c3::AssertInt8Equals(0xab,"0xa_b",Both);
  anon_unknown.dwarf_b35c3::AssertInt8Equals(0xab,"+0xa_b",SignedAndUnsigned);
  anon_unknown.dwarf_b35c3::AssertInt8Equals(0x85,"-0x7_b",SignedAndUnsigned);
  return;
}

Assistant:

TEST(ParseInt8, Underscores) {
  AssertInt8Equals(123, "12_3", Both);
  AssertInt8Equals(123, "+12_3", SignedAndUnsigned);
  AssertInt8Equals(-123, "-1_23", SignedAndUnsigned);
  AssertInt8Equals(19, "1______9", Both);
  AssertInt8Equals(0xab, "0xa_b", Both);
  AssertInt8Equals(0xab, "+0xa_b", SignedAndUnsigned);
  AssertInt8Equals(-0x7b, "-0x7_b", SignedAndUnsigned);
}